

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_frequency_transform.cc
# Opt level: O0

void __thiscall
sptk::SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform
          (SecondOrderAllPassFrequencyTransform *this,int num_input_order,int num_output_order,
          int fft_length,double alpha,double theta)

{
  bool bVar1;
  double dVar2;
  double theta_00;
  reference pvVar3;
  reference pvVar4;
  InverseFastFourierTransform *this_00;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar5;
  undefined8 in_XMM1_Qa;
  int m2_1;
  int m1_1;
  int m1;
  int m2;
  int j_2;
  int j_1;
  int m;
  InverseFastFourierTransform inverse_fourier_transform;
  double omega;
  int j;
  double delta;
  vector<double,_std::allocator<double>_> dw;
  vector<double,_std::allocator<double>_> ww;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  int output_length;
  int input_length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd8;
  value_type vVar6;
  InverseFastFourierTransform *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  double in_stack_fffffffffffffdf8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe00;
  double in_stack_fffffffffffffe08;
  double in_stack_fffffffffffffe10;
  undefined1 *alpha_00;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_148;
  int local_144;
  int local_fc;
  undefined1 local_e9;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  int local_3c;
  int local_38;
  int local_14;
  
  *in_RDI = &PTR__SecondOrderAllPassFrequencyTransform_0013d720;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  in_RDI[2] = in_XMM0_Qa;
  in_RDI[3] = in_XMM1_Qa;
  *(undefined1 *)(in_RDI + 4) = 1;
  local_14 = in_ECX;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1150d9);
  if ((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 0)) ||
      (local_14 <= *(int *)(in_RDI + 1))) ||
     ((bVar1 = IsValidAlpha((double)in_RDI[2]), !bVar1 ||
      (bVar1 = IsInRange((double)in_RDI[3],0.0,3.141592653589793), !bVar1)))) {
    *(undefined1 *)(in_RDI + 4) = 0;
  }
  else {
    local_38 = *(int *)(in_RDI + 1) + 1;
    local_3c = *(int *)((long)in_RDI + 0xc) + 1;
    std::allocator<double>::allocator((allocator<double> *)0x1151e3);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x115217);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
             (value_type *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x11524b);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::allocator<double>::~allocator((allocator<double> *)0x115265);
    std::allocator<double>::allocator((allocator<double> *)0x115297);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1152c8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
             (value_type *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1152f6);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::allocator<double>::~allocator((allocator<double> *)0x115310);
    dVar2 = (double)(long)local_14;
    std::allocator<double>::allocator((allocator<double> *)0x11532f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::allocator<double>::~allocator((allocator<double> *)0x115355);
    theta_00 = (double)(long)local_14;
    alpha_00 = &local_e9;
    std::allocator<double>::allocator((allocator<double> *)0x115374);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::allocator<double>::~allocator((allocator<double> *)0x11539a);
    for (local_fc = 0; local_fc < local_14; local_fc = local_fc + 1) {
      dVar5 = Warp(dVar2,(double)alpha_00,theta_00);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_c8,(long)local_fc);
      *pvVar3 = dVar5;
      dVar5 = anon_unknown_1::DiffWarp
                        (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         (double)in_stack_fffffffffffffe00);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_e8,(long)local_fc);
      *pvVar3 = dVar5;
    }
    InverseFastFourierTransform::InverseFastFourierTransform
              (in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    for (local_144 = 0; local_144 <= *(int *)((long)in_RDI + 0xc); local_144 = local_144 + 1) {
      for (local_148 = 0; local_148 < local_14; local_148 = local_148 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_c8,(long)local_148);
        in_stack_fffffffffffffdf8 = cos(*pvVar3 * (double)local_144);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_e8,(long)local_148)
        ;
        in_stack_fffffffffffffe00 =
             (vector<double,_std::allocator<double>_> *)(in_stack_fffffffffffffdf8 * *pvVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_58,(long)local_144);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_148);
        *pvVar3 = (value_type)in_stack_fffffffffffffe00;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_c8,(long)local_148);
        dVar2 = sin(*pvVar3 * (double)local_144);
        dVar2 = -dVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_e8,(long)local_148)
        ;
        dVar2 = dVar2 * *pvVar3;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_90,(long)local_144);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_148);
        *pvVar3 = dVar2;
      }
      this_00 = (InverseFastFourierTransform *)
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&local_58,(long)local_144);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](local_90,(long)local_144);
      in_stack_fffffffffffffdf7 =
           InverseFastFourierTransform::Run
                     (this_00,(vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,
                      in_stack_fffffffffffffdd8);
      if (!(bool)in_stack_fffffffffffffdf7) {
        *(undefined1 *)(in_RDI + 4) = 0;
        bVar1 = true;
        goto LAB_00115897;
      }
      for (local_150 = 1; local_150 <= *(int *)(in_RDI + 1); local_150 = local_150 + 1) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_58,(long)local_144);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar4,(long)(local_14 - local_150));
        in_stack_fffffffffffffde0 = (InverseFastFourierTransform *)*pvVar3;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_58,(long)local_144);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_150);
        *pvVar3 = (double)in_stack_fffffffffffffde0 + *pvVar3;
      }
    }
    bVar1 = false;
LAB_00115897:
    InverseFastFourierTransform::~InverseFastFourierTransform
              ((InverseFastFourierTransform *)0x1158a4);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    if (!bVar1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8);
      for (local_154 = 0; local_154 <= *(int *)((long)in_RDI + 0xc); local_154 = local_154 + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)(in_RDI + 5),(long)local_154);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8);
        for (local_158 = 0; local_158 <= *(int *)(in_RDI + 1); local_158 = local_158 + 1) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_58,(long)local_154);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_158);
          vVar6 = *pvVar3;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(in_RDI + 5),(long)local_154);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_158);
          *pvVar3 = vVar6;
        }
      }
      for (local_15c = 1; local_15c <= *(int *)(in_RDI + 1); local_15c = local_15c + 1) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 5),0);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_15c);
        *pvVar3 = *pvVar3 * 0.5;
      }
      for (local_160 = 1; local_160 <= *(int *)((long)in_RDI + 0xc); local_160 = local_160 + 1) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 5),(long)local_160);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
        *pvVar3 = *pvVar3 * 2.0;
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  }
  return;
}

Assistant:

SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform(
    int num_input_order, int num_output_order, int fft_length, double alpha,
    double theta)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      alpha_(alpha),
      theta_(theta),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      fft_length <= num_input_order_ || !sptk::IsValidAlpha(alpha_) ||
      !sptk::IsInRange(theta_, 0.0, sptk::kPi)) {
    is_valid_ = false;
    return;
  }

  const int input_length(num_input_order_ + 1);
  const int output_length(num_output_order_ + 1);
  std::vector<std::vector<double> > real(output_length,
                                         std::vector<double>(fft_length));
  std::vector<std::vector<double> > imag(output_length,
                                         std::vector<double>(fft_length));
  {
    std::vector<double> ww(fft_length);
    std::vector<double> dw(fft_length);
    {
      const double delta(sptk::kTwoPi / fft_length);
      for (int j(0); j < fft_length; ++j) {
        const double omega(delta * j);
        ww[j] = sptk::Warp(omega, alpha, theta);
        dw[j] = DiffWarp(omega, alpha, theta);
      }
    }

    sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
    for (int m(0); m <= num_output_order_; ++m) {
      for (int j(0); j < fft_length; ++j) {
        real[m][j] = std::cos(ww[j] * m) * dw[j];
        imag[m][j] = -std::sin(ww[j] * m) * dw[j];
      }

      if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
        is_valid_ = false;
        return;
      }

      for (int j(1); j <= num_input_order_; ++j) {
        real[m][j] += real[m][fft_length - j];
      }
    }
  }

  conversion_matrix_.resize(output_length);
  for (int m2(0); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2].resize(input_length);
    for (int m1(0); m1 <= num_input_order_; ++m1) {
      conversion_matrix_[m2][m1] = real[m2][m1];
    }
  }
  for (int m1(1); m1 <= num_input_order_; ++m1) {
    conversion_matrix_[0][m1] *= 0.5;
  }
  for (int m2(1); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2][0] *= 2.0;
  }
}